

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedmatting.cpp
# Opt level: O3

double __thiscall SharedMatting::aP(SharedMatting *this,int i,int j,double pf,Scalar *f,Scalar *b)

{
  double dVar1;
  double dVar2;
  uchar *puVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  puVar3 = this->data;
  lVar4 = (long)(j * this->channels + i * this->step);
  dVar5 = (b->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
  dVar1 = (b->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
  dVar2 = (b->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
  dVar7 = (f->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0] - dVar5;
  dVar8 = (f->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1] - dVar1;
  dVar6 = (f->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2] - dVar2;
  dVar5 = (((double)puVar3[lVar4 + 2] - dVar2) * dVar6 +
          ((double)puVar3[lVar4] - dVar5) * dVar7 + ((double)puVar3[lVar4 + 1] - dVar1) * dVar8) /
          (dVar6 * dVar6 + dVar7 * dVar7 + dVar8 * dVar8 + 1e-07);
  if (dVar5 <= 0.0) {
    dVar5 = 0.0;
  }
  if (1.0 <= dVar5) {
    dVar5 = 1.0;
  }
  return pf + (1.0 - (pf + pf)) * dVar5;
}

Assistant:

double SharedMatting::aP(int i, int j, double pf, Scalar f, Scalar b)
{
    int bc = data[i * step + j * channels];
    int gc = data[i * step + j * channels + 1];
    int rc = data[i * step + j * channels + 2];
    Scalar c = Scalar(bc, gc, rc);

    double alpha = comalpha(c, f, b);

    return pf + (1 - 2 * pf) * alpha;
}